

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O1

void __thiscall
PFData_test_fileReadPoint1_Test::~PFData_test_fileReadPoint1_Test
          (PFData_test_fileReadPoint1_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(PFData_test, fileReadPoint1){
    PFData test("tests/inputs/press.init.pfb");
    int retval = test.loadHeader();
    EXPECT_EQ(0,retval);

    retval = test.loadPQR();
    EXPECT_EQ(0,retval);
    EXPECT_EQ(1, test.getR());
    EXPECT_EQ(4, test.getQ());
    EXPECT_EQ(4, test.getP());

    PFData base("tests/inputs/press.init.pfb");
    base.loadHeader();
    base.loadData();
    for(int z = 0; z < test.getNZ(); ++z){
        for(int y = 0; y < test.getNY(); ++y){
            for(int x = 0; x < test.getNX(); ++x){
                EXPECT_EQ(base(z, y, x), test.fileReadPoint(z, y, x));
            }
        }
    }

    EXPECT_NEAR(98.003604098773,    test.fileReadPoint(0,0,0),1E-12);
    EXPECT_NEAR(97.36460429313328,  test.fileReadPoint(0,0,40),1E-12);
    EXPECT_NEAR(98.0043134691891,   test.fileReadPoint(0,1,0),1E-12);
    EXPECT_NEAR(98.00901307022781,  test.fileReadPoint(0,0,1),1E-12);
    EXPECT_NEAR(92.61370155558751,  test.fileReadPoint(2,1,21),1E-12);
    EXPECT_NEAR(7.98008728357588,   test.fileReadPoint(45,1,0),1E-12);
    EXPECT_NEAR(97.30205516102234,  test.fileReadPoint(0,1,22),1E-12);

    EXPECT_EQ(0, test.getSubgridIndexX(0));
    EXPECT_EQ(3, test.getSubgridIndexX(40));

    test.close();
}